

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.h
# Opt level: O2

void __thiscall
my_algorithm::WeightedDigraphSPDijkstra<int,_int>::WeightedDigraphSPDijkstra
          (WeightedDigraphSPDijkstra<int,_int> *this,WeightedDigraph<int,_int> *graph,int vertex)

{
  SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  *this_00;
  PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this_01;
  int vertex_local;
  SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  *local_50;
  WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
  local_48;
  
  this->_vptr_WeightedDigraphSPDijkstra = (_func_int **)&PTR__WeightedDigraphSPDijkstra_0010ba88;
  this_00 = &this->_edge_to;
  vertex_local = vertex;
  data_structures::
  SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  ::SymbolTable(this_00);
  local_50 = this_00;
  data_structures::SymbolTable<int,_int>::SymbolTable(&this->_weight_to);
  this_01 = &this->_queue;
  data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
  PriorityQueue(this_01);
  this->_start = vertex;
  data_structures::
  LinkedList<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  ::clear(&(this->_edge_to)._list);
  data_structures::LinkedList<data_structures::SymbolTableElement<int,_int>_>::clear
            (&(this->_weight_to)._list);
  data_structures::LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::clear
            (&(this->_queue)._list);
  local_48.from =
       data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::getNode
                 (&(graph->super_WeightedGraph<int,_int>)._tree,&vertex_local);
  local_48.weight = 0;
  local_48.to = local_48.from;
  data_structures::
  SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  ::set(this_00,&vertex_local,&local_48);
  local_48.from =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)((ulong)local_48.from & 0xffffffff00000000);
  data_structures::SymbolTable<int,_int>::set(&this->_weight_to,&vertex_local,(int *)&local_48);
  local_48.from =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)(ulong)(uint)this->_start;
  data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
  enqueue(this_01,(SPElement *)&local_48);
  while ((this->_queue)._list._header != (this->_queue)._list._tail) {
    data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
    dequeueMinN((PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)
                &local_48,(size_t)this_01);
    _relax(this,graph,(SPElement *)&local_48);
  }
  return;
}

Assistant:

WeightedDigraphSPDijkstra(WeightedDigraph<T, Weight> &graph, T vertex) {
            _start = vertex;
            _edge_to.clear();
            _weight_to.clear();
            _queue.clear();
            auto start = graph.getNode(vertex);
            _edge_to.set(vertex, Edge(start, start, Weight()));
            _weight_to.set(vertex, Weight());
            _queue.enqueue(SPElement(_start, Weight()));
            while (!_queue.isEmpty()) {
                _relax(graph, _queue.dequeueMinN(1));
            }
        }